

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type * __thiscall
FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>::dx
          (value_type *__return_storage_ptr__,FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_> *this
          ,int i)

{
  Fad<Fad<double>_> *pFVar1;
  FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_> local_20;
  
  pFVar1 = this->left_;
  local_20.fadexpr_.left_ = &pFVar1->defaultVal;
  if ((pFVar1->dx_).num_elts != 0) {
    local_20.fadexpr_.left_ = (pFVar1->dx_).ptr_to_data + i;
  }
  local_20.fadexpr_.right_.constant_ = (this->right_).constant_;
  local_20.fadexpr_.right_.defaultVal = 0.0;
  Fad<double>::Fad<FadBinaryDiv<Fad<double>,FadCst<double>>>(__return_storage_ptr__,&local_20);
  return __return_storage_ptr__;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) / right_.val();}